

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall
cppforth::Forth::MoveFileHandle
          (Forth *this,Cell handler,
          shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *fileHandle_,
          string *function,errorCodes ec)

{
  bool bVar1;
  reference pFVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_40;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_38;
  iterator it;
  errorCodes ec_local;
  string *function_local;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *fileHandle__local;
  Cell handler_local;
  Forth *this_local;
  
  it._M_current._4_4_ = ec;
  local_38._M_current =
       (ForthFile *)
       std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::begin
                 (&this->OpenFiles);
  while( true ) {
    local_40._M_current =
         (ForthFile *)
         std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::end
                   (&this->OpenFiles);
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                      (&local_38,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::operator+(&local_60,function,": wrong file handler access");
      throwMessage(this,&local_60,it._M_current._4_4_);
      std::__cxx11::string::~string((string *)&local_60);
      uVar3 = __cxa_rethrow();
      std::__cxx11::string::~string((string *)&local_60);
      _Unwind_Resume(uVar3);
    }
    pFVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
             ::operator*(&local_38);
    if (pFVar2->FILE == handler) break;
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
    ::operator++(&local_38);
  }
  pFVar2 = __gnu_cxx::
           __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
           ::operator*(&local_38);
  std::swap<std::fstream>(&pFVar2->fileObject,fileHandle_);
  return;
}

Assistant:

void  MoveFileHandle(Cell handler,std::shared_ptr<std::fstream>& fileHandle_,  const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler) {
			std::swap((*it).fileObject, fileHandle_);
			return;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}